

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_4::GLES2Program::GLES2Program(GLES2Program *this,Functions *gl)

{
  GLint GVar1;
  ProgramSources *pPVar2;
  allocator<char> local_24a;
  allocator<char> local_249;
  string local_248;
  string local_228;
  undefined1 local_208 [40];
  undefined1 local_1e0 [40];
  ProgramSources local_1b8;
  ProgramSources local_e8;
  
  (this->super_Program)._vptr_Program = (_func_int **)&PTR__GLES2Program_01e0ffd0;
  this->m_gl = gl;
  memset(&local_e8,0,0xac);
  local_e8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_e8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_e8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_e8._193_8_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,
             "attribute highp vec4 a_position;\nattribute mediump vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,&local_249);
  glu::VertexSource::VertexSource((VertexSource *)local_1e0,&local_228);
  pPVar2 = glu::ProgramSources::operator<<(&local_e8,(ShaderSource *)local_1e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,
             "varying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_FragColor = v_color;\n}\n",
             &local_24a);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_208,&local_248);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_208);
  glu::ProgramSources::ProgramSources(&local_1b8,pPVar2);
  std::__cxx11::string::~string((string *)(local_208 + 8));
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)(local_1e0 + 8));
  std::__cxx11::string::~string((string *)&local_228);
  glu::ProgramSources::~ProgramSources(&local_e8);
  glu::ShaderProgram::ShaderProgram(&this->m_program,gl,&local_1b8);
  glu::ProgramSources::~ProgramSources(&local_1b8);
  this->m_positionLoc = 0;
  this->m_colorLoc = 0;
  GVar1 = (*this->m_gl->getAttribLocation)((this->m_program).m_program.m_program,"a_position");
  this->m_positionLoc = GVar1;
  GVar1 = (*this->m_gl->getAttribLocation)((this->m_program).m_program.m_program,"a_color");
  this->m_colorLoc = GVar1;
  return;
}

Assistant:

GLES2Program (const glw::Functions& gl)
		: m_gl				(gl)
		, m_program			(gl, getProgramSourcesES2())
		, m_positionLoc		(0)
		, m_colorLoc		(0)
	{

		m_positionLoc	= m_gl.getAttribLocation(m_program.getProgram(), "a_position");
		m_colorLoc		= m_gl.getAttribLocation(m_program.getProgram(), "a_color");
	}